

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

size_t testing::internal::GetThreadCount(void)

{
  ostream *this;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ss;
  __pid_t _Var1;
  size_t sVar2;
  int iVar3;
  string filename;
  string dummy;
  ifstream file;
  int local_26c;
  string local_268;
  undefined1 *local_248;
  undefined8 local_240;
  undefined1 local_238 [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228 [65];
  
  Message::Message((Message *)local_228);
  ss.ptr_ = local_228[0].ptr_;
  this = (ostream *)(local_228[0].ptr_ + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(this,"/proc/",6);
  _Var1 = getpid();
  std::ostream::operator<<((ostream *)this,_Var1);
  std::__ostream_insert<char,std::char_traits<char>>(this,"/stat",5);
  StringStreamToString(&local_268,ss.ptr_);
  if (ss.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)ss.ptr_ + 8))(ss.ptr_);
    local_228[0].ptr_ = (stringstream *)0x0;
  }
  local_240 = 0;
  local_238[0] = 0;
  local_248 = local_238;
  std::ifstream::ifstream(local_228,local_268._M_dataplus._M_p,_S_in);
  iVar3 = -0x14;
  while (iVar3 = iVar3 + 1, iVar3 != 0) {
    std::operator>>((istream *)local_228,(string *)&local_248);
  }
  local_26c = 0;
  std::istream::operator>>((istream *)local_228,&local_26c);
  sVar2 = (size_t)local_26c;
  std::ifstream::~ifstream(local_228);
  if (local_248 != local_238) {
    operator_delete(local_248);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  return sVar2;
}

Assistant:

size_t GetThreadCount() {
  const std::string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<int>(filename, 19);
}